

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadCodePointRest<false>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,codepoint_t lower,
          EncodedCharPtr *startingLocation,EncodedCharPtr endOfSource,codepoint_t *outChar,
          bool *outContainsMultiUnitChar)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  OLECHAR OVar4;
  codepoint_t cVar5;
  undefined4 *puVar6;
  EncodedCharPtr local_40;
  EncodedCharPtr currentLocation;
  
  currentLocation = outContainsMultiUnitChar;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14d,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar3) goto LAB_00f18548;
    *puVar6 = 0;
  }
  if (currentLocation == (EncodedCharPtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14e,"(outContainsMultiUnitChar != nullptr)",
                       "outContainsMultiUnitChar != nullptr");
    if (!bVar3) goto LAB_00f18548;
    *puVar6 = 0;
  }
  if (this->es6UnicodeMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14f,"(es6UnicodeMode)","es6UnicodeMode");
    if (!bVar3) goto LAB_00f18548;
    *puVar6 = 0;
  }
  bVar3 = Js::NumberUtilities::IsSurrogateLowerPart(lower);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x150,"(Js::NumberUtilities::IsSurrogateLowerPart(lower))",
                       "Js::NumberUtilities::IsSurrogateLowerPart(lower)");
    if (!bVar3) {
LAB_00f18548:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  local_40 = *startingLocation;
  *outChar = lower;
  if (local_40 < endOfSource) {
    sVar1 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    OVar4 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                      (&this->super_UTF8EncodingPolicyBase<false>,&local_40,endOfSource);
    bVar3 = Js::NumberUtilities::IsSurrogateUpperPart((uint)(ushort)OVar4);
    if (bVar3) {
      cVar5 = Js::NumberUtilities::SurrogatePairAsCodePoint(lower,(uint)(ushort)OVar4);
      *outChar = cVar5;
      if (0x7f < (ushort)OVar4) {
        *currentLocation = '\x01';
      }
      *startingLocation = local_40;
    }
    else {
      (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = sVar1;
    }
  }
  return true;
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadCodePointRest(codepoint_t lower, EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar, bool *outContainsMultiUnitChar)

{
    Assert(outChar != nullptr);
    Assert(outContainsMultiUnitChar != nullptr);
    Assert(es6UnicodeMode);
    Assert(Js::NumberUtilities::IsSurrogateLowerPart(lower));

    EncodedCharPtr currentLocation = startingLocation;
    *outChar = lower;

    if (currentLocation < endOfSource)
    {
        size_t restorePoint = this->m_cMultiUnits;
        codepoint_t upper = this->template ReadFull<bScan>(currentLocation, endOfSource);

        if (Js::NumberUtilities::IsSurrogateUpperPart(upper))
        {
            *outChar = Js::NumberUtilities::SurrogatePairAsCodePoint(lower, upper);

            if (this->IsMultiUnitChar(static_cast<OLECHAR>(upper)))
            {
                *outContainsMultiUnitChar = true;
            }

            startingLocation = currentLocation;
        }
        else
        {
            this->RestoreMultiUnits(restorePoint);
        }
    }

    return true;
}